

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_2.cpp
# Opt level: O0

double ctok(double c)

{
  runtime_error *this;
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  undefined8 local_18;
  double absoluteZero;
  double c_local;
  
  local_18 = 0xc071126666666666;
  if (c < -273.15) {
    absoluteZero = c;
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::to_string(&local_58,absoluteZero);
    std::operator+(&local_38,"Temperature cannot be below absolute zero. Provided: ",&local_58);
    std::runtime_error::runtime_error(this,(string *)&local_38);
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return c + 273.15;
}

Assistant:

double ctok(double c)
// converts Celsius to Kelvin
{
	constexpr const double absoluteZero = -273.15;
	if (c < absoluteZero)
		throw std::runtime_error(
			"Temperature cannot be below absolute zero. Provided: " + std::to_string(c));
	return c + 273.15;
}